

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O3

void __thiscall
UnifiedRegex::CharSet<unsigned_int>::SetRange
          (CharSet<unsigned_int> *this,ArenaAllocator *allocator,Char lc,Char hc)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Char lc_00;
  uint uVar4;
  CharSet<char16_t> *this_00;
  uint uVar5;
  long lVar6;
  
  if (hc < lc) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x623,"(lc <= hc)","lc <= hc");
    if (!bVar2) goto LAB_00e5d44b;
    *puVar3 = 0;
  }
  if (0x10ffff < lc) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                       ,0x26d,"(c <= Chars<codepoint_t>::MaxUChar)",
                       "c <= Chars<codepoint_t>::MaxUChar");
    if (!bVar2) goto LAB_00e5d44b;
    *puVar3 = 0;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                       ,0xb6,"(c <= MaxChar)","c <= MaxChar");
    if (!bVar2) goto LAB_00e5d44b;
    *puVar3 = 0;
  }
  if (0x10ffff < hc) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                       ,0x26d,"(c <= Chars<codepoint_t>::MaxUChar)",
                       "c <= Chars<codepoint_t>::MaxUChar");
    if (!bVar2) goto LAB_00e5d44b;
    *puVar3 = 0;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                       ,0xb6,"(c <= MaxChar)","c <= MaxChar");
    if (!bVar2) goto LAB_00e5d44b;
    *puVar3 = 0;
  }
  uVar4 = lc >> 0x10;
  uVar5 = hc >> 0x10;
  lc_00 = (Char)lc;
  if (uVar4 == uVar5) {
    if (0x10ffff < lc) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                         ,0x274,"(c <= Chars<codepoint_t>::MaxUChar)",
                         "c <= Chars<codepoint_t>::MaxUChar");
      if (!bVar2) goto LAB_00e5d44b;
      *puVar3 = 0;
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                         ,0xb6,"(c <= MaxChar)","c <= MaxChar");
      if (!bVar2) goto LAB_00e5d44b;
      *puVar3 = 0;
    }
    if (0x10ffff < hc) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                         ,0x274,"(c <= Chars<codepoint_t>::MaxUChar)",
                         "c <= Chars<codepoint_t>::MaxUChar");
      if (bVar2) {
        *puVar3 = 0;
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                           ,0xb6,"(c <= MaxChar)","c <= MaxChar");
        if (bVar2) {
          *puVar3 = 0;
          goto LAB_00e5d438;
        }
      }
LAB_00e5d44b:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  else {
    if (0x10ffff < lc) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                         ,0x274,"(c <= Chars<codepoint_t>::MaxUChar)",
                         "c <= Chars<codepoint_t>::MaxUChar");
      if (!bVar2) goto LAB_00e5d44b;
      *puVar3 = 0;
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                         ,0xb6,"(c <= MaxChar)","c <= MaxChar");
      if (!bVar2) goto LAB_00e5d44b;
      *puVar3 = 0;
    }
    if (0x10ffff < hc) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                         ,0x274,"(c <= Chars<codepoint_t>::MaxUChar)",
                         "c <= Chars<codepoint_t>::MaxUChar");
      if (!bVar2) goto LAB_00e5d44b;
      *puVar3 = 0;
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Chars.h"
                         ,0xb6,"(c <= MaxChar)","c <= MaxChar");
      if (!bVar2) goto LAB_00e5d44b;
      *puVar3 = 0;
    }
    if (lc_00 != L'\0') {
      CharSet<char16_t>::SetRange(this->characterPlanes + uVar4,allocator,lc_00,L'\xffff');
      uVar4 = uVar4 + 1;
    }
    if (uVar4 < uVar5) {
      this_00 = this->characterPlanes + uVar4;
      lVar6 = (ulong)uVar5 - (ulong)uVar4;
      do {
        CharSet<char16_t>::SetRange(this_00,allocator,L'\0',L'\xffff');
        this_00 = this_00 + 1;
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
    }
    lc_00 = L'\0';
    uVar4 = uVar5;
  }
LAB_00e5d438:
  CharSet<char16_t>::SetRange(this->characterPlanes + uVar4,allocator,lc_00,(Char)hc);
  return;
}

Assistant:

void CharSet<codepoint_t>::SetRange(ArenaAllocator* allocator, Char lc, Char hc)
    {
        Assert(lc <= hc);

        int lowerIndex = this->CharToIndex(lc);
        int upperIndex = this->CharToIndex(hc);

        if (lowerIndex == upperIndex)
        {
            this->characterPlanes[lowerIndex].SetRange(allocator, this->RemoveOffset(lc), this->RemoveOffset(hc));
        }
        else
        {
            // Do the partial ranges
            char16 partialLower = this->RemoveOffset(lc);
            char16 partialHigher = this->RemoveOffset(hc);

            if (partialLower != 0)
            {
                this->characterPlanes[lowerIndex].SetRange(allocator, partialLower, Chars<char16>::MaxUChar);
                lowerIndex++;
            }

            for(; lowerIndex < upperIndex; lowerIndex++)
            {
                this->characterPlanes[lowerIndex].SetRange(allocator, 0, Chars<char16>::MaxUChar);
            }

            this->characterPlanes[upperIndex].SetRange(allocator, 0, partialHigher);
        }
    }